

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

lua_Unsigned luaH_getn(Table *t)

{
  int *piVar1;
  uint uVar2;
  Value *pVVar3;
  TValue *pTVar4;
  ulong uVar5;
  lua_Unsigned lVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  lua_Unsigned unaff_R14;
  ulong uVar14;
  bool bVar15;
  
  uVar2 = t->asize;
  uVar14 = (ulong)uVar2;
  if (uVar14 != 0) {
    pVVar3 = t->array;
    uVar8 = *(uint *)pVVar3;
    uVar10 = 1;
    if (1 < uVar8) {
      uVar10 = uVar8;
    }
    if ((*(byte *)((long)pVVar3 + (ulong)(uVar10 - 1) + 4) & 0xf) == 0) {
      bVar15 = 1 < uVar8;
      if (bVar15) {
        uVar7 = 3;
        if (uVar10 - 2 < 3) {
          uVar7 = uVar10 - 2;
        }
        pbVar9 = (byte *)((long)pVVar3 + (ulong)uVar8 + 2);
        iVar11 = uVar7 + 1;
        uVar10 = -uVar10;
        do {
          if ((*pbVar9 & 0xf) != 0) {
            unaff_R14 = (lua_Unsigned)~uVar10;
            *(uint *)pVVar3 = ~uVar10;
            bVar15 = false;
            goto LAB_0011bb5b;
          }
          pbVar9 = pbVar9 + -1;
          uVar10 = uVar10 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        uVar10 = -uVar10;
        bVar15 = 1 < uVar10;
      }
      uVar8 = 0;
      if (bVar15) {
        uVar8 = 0;
        do {
          uVar7 = uVar10 + uVar8 >> 1;
          if ((*(byte *)((long)pVVar3 + (ulong)(uVar7 - 1) + 4) & 0xf) == 0) {
            uVar10 = uVar7;
            uVar7 = uVar8;
          }
          uVar8 = uVar7;
        } while (1 < uVar10 - uVar8);
      }
      *(uint *)pVVar3 = uVar8;
      unaff_R14 = (lua_Unsigned)uVar8;
LAB_0011bb59:
      bVar15 = false;
    }
    else {
      if (uVar10 < uVar2) {
        lVar6 = 1;
        if (1 < uVar8) {
          lVar6 = (lua_Unsigned)uVar8;
        }
        unaff_R14 = lVar6;
        uVar8 = 0;
        do {
          if ((*(byte *)((long)pVVar3 + unaff_R14 + 4) & 0xf) == 0) {
            *(uint *)pVVar3 = (int)lVar6 + uVar8;
            goto LAB_0011bb4c;
          }
          unaff_R14 = unaff_R14 + 1;
          uVar10 = uVar8 + 1;
        } while ((unaff_R14 < uVar14) && (bVar15 = uVar8 < 3, uVar8 = uVar10, bVar15));
        uVar10 = (int)lVar6 + uVar10;
      }
      if ((*(byte *)((long)pVVar3 + (ulong)(uVar2 - 1) + 4) & 0xf) == 0) {
        uVar7 = uVar2 - uVar10;
        uVar8 = uVar2;
        while (1 < uVar7) {
          uVar12 = uVar8 + uVar10 >> 1;
          if ((*(byte *)((long)pVVar3 + (ulong)(uVar12 - 1) + 4) & 0xf) == 0) {
            uVar8 = uVar12;
            uVar12 = uVar10;
          }
          uVar10 = uVar12;
          uVar7 = uVar8 - uVar12;
        }
        *(uint *)pVVar3 = uVar10;
        unaff_R14 = (lua_Unsigned)uVar10;
LAB_0011bb4c:
        bVar15 = false;
      }
      else {
        bVar15 = true;
      }
      if (!bVar15) goto LAB_0011bb59;
      *(uint *)pVVar3 = uVar2;
      bVar15 = true;
    }
LAB_0011bb5b:
    if (!bVar15) {
      return unaff_R14;
    }
  }
  if ((t->flags & 0x40) != 0) {
    return uVar14;
  }
  pTVar4 = getintfromhash(t,(ulong)(uVar2 + 1));
  if ((pTVar4->tt_ & 0xf) == 0) {
    return uVar14;
  }
  uVar14 = (ulong)(uVar2 + (uVar2 == 0));
  do {
    lVar6 = uVar14;
    if (lVar6 >> 0x3e != 0) {
      uVar14 = 0x7fffffffffffffff;
      pTVar4 = (TValue *)
               (t->node +
               SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) %
                      ZEXT416(~(-1 << (t->lsizenode & 0x1f)) | 1),0));
      goto LAB_0011bbe8;
    }
    uVar14 = lVar6 * 2;
    pTVar4 = getintfromhash(t,uVar14);
  } while ((pTVar4->tt_ & 0xf) != 0);
LAB_0011bc0e:
  uVar5 = uVar14 - lVar6;
  while (1 < uVar5) {
    uVar5 = uVar14 + lVar6 >> 1;
    pTVar4 = getintfromhash(t,uVar5);
    uVar13 = uVar5;
    if ((pTVar4->tt_ & 0xf) != 0) {
      uVar13 = uVar14;
      lVar6 = uVar5;
    }
    uVar14 = uVar13;
    uVar5 = uVar13 - lVar6;
  }
  return lVar6;
  while (piVar1 = &((NodeKey *)pTVar4)->next,
        pTVar4 = (TValue *)((long)pTVar4 + (long)*piVar1 * 0x18), (long)*piVar1 != 0) {
LAB_0011bbe8:
    if ((((NodeKey *)pTVar4)->key_tt == '\x03') &&
       ((((NodeKey *)pTVar4)->key_val).gc == (GCObject *)0x7fffffffffffffff)) goto LAB_0011bc08;
  }
  pTVar4 = &absentkey;
LAB_0011bc08:
  if ((((NodeKey *)pTVar4)->tt_ & 0xf) != 0) {
    return 0x7fffffffffffffff;
  }
  goto LAB_0011bc0e;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned asize = t->asize;
  if (asize > 0) {  /* is there an array part? */
    const unsigned maxvicinity = 4;
    unsigned limit = *lenhint(t);  /* start with the hint */
    if (limit == 0)
      limit = 1;  /* make limit a valid index in the array */
    if (arraykeyisempty(t, limit)) {  /* t[limit] empty? */
      /* there must be a border before 'limit' */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit > 1; i++) {
        limit--;
        if (!arraykeyisempty(t, limit))
          return newhint(t, limit);  /* 'limit' is a border */
      }
      /* t[limit] still empty; search for a border in [0, limit) */
      return newhint(t, binsearch(t, 0, limit));
    }
    else {  /* 'limit' is present in table; look for a border after it */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit < asize; i++) {
        limit++;
        if (arraykeyisempty(t, limit))
          return newhint(t, limit - 1);  /* 'limit - 1' is a border */
      }
      if (arraykeyisempty(t, asize)) {  /* last element empty? */
        /* t[limit] not empty; search for a border in [limit, asize) */
        return newhint(t, binsearch(t, limit, asize));
      }
    }
    /* last element non empty; set a hint to speed up finding that again */
    /* (keys in the hash part cannot be hints) */
    *lenhint(t) = asize;
  }
  /* no array part or t[asize] is not empty; check the hash part */
  lua_assert(asize == 0 || !arraykeyisempty(t, asize));
  if (isdummy(t) || hashkeyisempty(t, asize + 1))
    return asize;  /* 'asize + 1' is empty */
  else  /* 'asize + 1' is also non empty */
    return hash_search(t, asize);
}